

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpParser.h
# Opt level: O2

string_view __thiscall uWS::HttpRequest::getHeader(HttpRequest *this,string_view lowerCasedHeader)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char **ppcVar4;
  size_t sVar5;
  string_view sVar6;
  
  bVar1 = BloomFilter::mightHave(&this->bf,lowerCasedHeader);
  sVar5 = 0;
  pcVar3 = (char *)0x0;
  if (bVar1) {
    sVar5 = 0;
    for (ppcVar4 = &this->headers[1].value._M_str; ppcVar4[-3] != (char *)0x0; ppcVar4 = ppcVar4 + 4
        ) {
      if (ppcVar4[-3] == (char *)lowerCasedHeader._M_len) {
        iVar2 = strncmp(ppcVar4[-2],lowerCasedHeader._M_str,lowerCasedHeader._M_len);
        if (iVar2 == 0) {
          sVar5 = ((string_view *)(ppcVar4 + -1))->_M_len;
          pcVar3 = *ppcVar4;
          goto LAB_001679be;
        }
      }
    }
    pcVar3 = (char *)0x0;
  }
LAB_001679be:
  sVar6._M_str = pcVar3;
  sVar6._M_len = sVar5;
  return sVar6;
}

Assistant:

std::string_view getHeader(std::string_view lowerCasedHeader) {
        if (bf.mightHave(lowerCasedHeader)) {
            for (Header *h = headers; (++h)->key.length(); ) {
                if (h->key.length() == lowerCasedHeader.length() && !strncmp(h->key.data(), lowerCasedHeader.data(), lowerCasedHeader.length())) {
                    return h->value;
                }
            }
        }
        return std::string_view(nullptr, 0);
    }